

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

bool __thiscall RootIndexProxyModel::canFetchMore(RootIndexProxyModel *this,QModelIndex *parent)

{
  undefined1 uVar1;
  long lVar2;
  long *plVar3;
  QModelIndex local_28;
  
  lVar2 = QAbstractProxyModel::sourceModel();
  if (lVar2 == 0) {
    uVar1 = 0;
  }
  else {
    local_28.r = -1;
    local_28.c = -1;
    local_28.i = 0;
    local_28.m = (QAbstractItemModel *)0x0;
    if (((parent->r < 0) || (parent->c < 0)) || (parent->m == (QAbstractItemModel *)0x0)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_28,&this->m_dptr->m_rootIndex);
    }
    else {
      (**(code **)(*(long *)this + 400))(&local_28,this,parent);
    }
    plVar3 = (long *)QAbstractProxyModel::sourceModel();
    uVar1 = (**(code **)(*plVar3 + 0x130))(plVar3,&local_28);
  }
  return (bool)uVar1;
}

Assistant:

bool RootIndexProxyModel::canFetchMore(const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(const RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->canFetchMore(sourceParent);
}